

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::TemperatureGroup> *
metaf::TemperatureGroup::parse
          (optional<metaf::TemperatureGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  unkbyte10 Var1;
  unkbyte10 Var2;
  bool bVar3;
  int iVar4;
  difference_type dVar5;
  optional<metaf::Temperature> oVar6;
  _Optional_base<metaf::Temperature,_true,_true> _Var7;
  string_type sStack_78;
  smatch match;
  
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rgx_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rgx_abi_cxx11_,"(M?\\d\\d|//)/(M?\\d\\d|//)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rgx_abi_cxx11_);
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rmkRgx_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rmkRgx_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rmkRgx_abi_cxx11_,"T([01]\\d\\d\\d)([01]\\d\\d\\d)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rmkRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rmkRgx_abi_cxx11_);
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (reportPart == RMK) {
    bVar3 = std::operator==(group,"T");
    if (bVar3) {
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = T_MISG;
    }
    else {
      bVar3 = std::operator==(group,"TD");
      if (!bVar3) {
        bVar3 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (group,&match,
                           &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                            ::rmkRgx_abi_cxx11_,0);
        if (bVar3) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&sStack_78,&match,1);
          oVar6 = Temperature::fromRemarkString(&sStack_78);
          Var2 = oVar6.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::Temperature>._M_payload._0_10_;
          std::__cxx11::string::~string((string *)&sStack_78);
          if ((oVar6.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::Temperature>._8_8_ >> 0x20 & 1) != 0) {
            dVar5 = std::__cxx11::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::length(&match,2);
            if (dVar5 == 0) goto LAB_00190324;
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::str(&sStack_78,&match,2);
            _Var7._M_payload.super__Optional_payload_base<metaf::Temperature> =
                 (_Optional_payload<metaf::Temperature,_true,_true,_true>)
                 Temperature::fromRemarkString(&sStack_78);
            goto LAB_0019020e;
          }
        }
        goto LAB_001902cb;
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = TD_MISG;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) = 0;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x14) = 0
    ;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18) = 0
    ;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.isIncomplete = true;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
    goto LAB_001902d9;
  }
  if ((reportPart == METAR) &&
     (bVar3 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (group,&match,
                         &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                          ::rgx_abi_cxx11_,0), bVar3)) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&sStack_78,&match,1);
    oVar6 = Temperature::fromString(&sStack_78);
    Var2 = oVar6.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Temperature>._M_payload._0_10_;
    std::__cxx11::string::~string((string *)&sStack_78);
    if ((oVar6.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Temperature>._8_8_ >> 0x20 & 1) != 0) {
      dVar5 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::length(&match,2);
      if (dVar5 == 0) {
LAB_00190324:
        Var1 = SUB1610(ZEXT816(0),0);
      }
      else {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_78,&match,2);
        _Var7._M_payload.super__Optional_payload_base<metaf::Temperature> =
             (_Optional_payload<metaf::Temperature,_true,_true,_true>)
             Temperature::fromString(&sStack_78);
LAB_0019020e:
        Var1 = _Var7._M_payload.super__Optional_payload_base<metaf::Temperature>._M_payload._0_10_;
        std::__cxx11::string::~string((string *)&sStack_78);
        if (((undefined1  [16])_Var7._M_payload.super__Optional_payload_base<metaf::Temperature> &
            (undefined1  [16])0x100000000) == (undefined1  [16])0x0) goto LAB_001902cb;
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp =
           TEMPERATURE_AND_DEW_POINT;
      *(int *)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
               t.tempValue.super__Optional_base<int,_true,_true>._M_payload = (int)Var2;
      *(char *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) =
           (char)((unkuint10)Var2 >> 0x20);
      *(short *)((long)&(__return_storage_ptr__->
                        super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                        super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 9) =
           (short)((unkuint10)Var2 >> 0x28);
      *(char *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xb) =
           (char)((unkuint10)Var2 >> 0x38);
      *(char *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) =
           (char)((unkuint10)Var2 >> 0x40);
      *(char *)((long)&(__return_storage_ptr__->
                       super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                       super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xd) =
           (char)((unkuint10)Var2 >> 0x48);
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.tempValue.
      super__Optional_base<int,_true,_true>._M_payload = (_Optional_payload_base<int>)SUB108(Var1,0)
      ;
      *(short *)((long)&(__return_storage_ptr__->
                        super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                        super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18) =
           (short)((unkuint10)Var1 >> 0x40);
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.isIncomplete =
           false;
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
      goto LAB_001902d9;
    }
  }
LAB_001902cb:
  (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.tempValue.
  super__Optional_base<int,_true,_true>._M_payload = (_Optional_payload<int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.freezing = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
           _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.t.
           tempValue.super__Optional_base<int,_true,_true> + 4) = 0;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = 0;
LAB_001902d9:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return __return_storage_ptr__;
}

Assistant:

std::optional<TemperatureGroup> TemperatureGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<TemperatureGroup> notRecognised;
	static const std::regex rgx("(M?\\d\\d|//)/(M?\\d\\d|//)?");
	static const auto matchTemperature = 1, matchDewPoint = 2;
	static const std::regex rmkRgx("T([01]\\d\\d\\d)([01]\\d\\d\\d)?");
	static const auto rmkMatchTemperature = 1, rmkMatchDewPoint = 2;
	std::smatch match;
	if (reportPart == ReportPart::METAR) {
		if (regex_match(group, match, rgx)) {
			const auto t = Temperature::fromString(match.str(matchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result(Type::TEMPERATURE_AND_DEW_POINT);
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromString(match.str(matchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "T") return TemperatureGroup(Type::T_MISG, true);
		if (group == "TD") return TemperatureGroup(Type::TD_MISG, true);
		if (regex_match(group, match, rmkRgx)) {
			const auto t = Temperature::fromRemarkString(match.str(rmkMatchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result;
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromRemarkString(match.str(rmkMatchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	return notRecognised;
}